

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

uint8_t get_last_nonzero_byte(uint8_t *data,size_t sz)

{
  size_t i;
  size_t sz_local;
  uint8_t *data_local;
  
  i = sz;
  do {
    if (i == 0) {
      return '\0';
    }
    i = i - 1;
  } while (data[i] == '\0');
  return data[i];
}

Assistant:

static uint8_t get_last_nonzero_byte(const uint8_t *data, size_t sz) {
  // Scan backward and return on the first nonzero byte.
  size_t i = sz;
  while (i != 0) {
    --i;
    if (data[i] != 0) return data[i];
  }
  return 0;
}